

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *pWVar1;
  Info local_58;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_58,(Opcode *)&Opcode::CallIndirect_Opcode);
  WritePuts(pWVar1,local_58.name,Space);
  if ((expr->table).field_2.index_ != 0 || (expr->table).type_ != Index) {
    WriteVar(this->writer_,&expr->table,Space);
  }
  pWVar1 = this->writer_;
  WritePuts(pWVar1,"(",None);
  WritePuts(pWVar1,"type",Space);
  pWVar1->indent_ = pWVar1->indent_ + 2;
  WriteVar(this->writer_,&(expr->decl).type_var,Newline);
  WriteClose(this->writer_,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  writer_->WriteVarUnlessZero(expr->table, NextChar::Space);
  writer_->WriteOpenSpace("type");
  writer_->WriteVar(expr->decl.type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}